

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O1

void av1_quantize_lp_c(int16_t *coeff_ptr,intptr_t n_coeffs,int16_t *round_ptr,int16_t *quant_ptr,
                      int16_t *qcoeff_ptr,int16_t *dqcoeff_ptr,int16_t *dequant_ptr,
                      uint16_t *eob_ptr,int16_t *scan,int16_t *iscan)

{
  ushort uVar1;
  ulong uVar2;
  uint16_t uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ushort uVar7;
  short sVar8;
  int iVar9;
  uint uVar10;
  
  memset(qcoeff_ptr,0,n_coeffs * 2);
  memset(dqcoeff_ptr,0,n_coeffs * 2);
  if (n_coeffs < 1) {
    uVar3 = 0;
  }
  else {
    uVar2 = 0xffffffff;
    uVar4 = 0;
    do {
      lVar5 = (long)scan[uVar4];
      uVar1 = coeff_ptr[lVar5];
      uVar7 = (short)uVar1 >> 0xf;
      uVar6 = (ulong)((uint)(lVar5 != 0) * 2);
      iVar9 = (int)*(short *)((long)round_ptr + uVar6) + (uint)(uVar1 >> 0xf) +
              (int)(short)(uVar7 ^ uVar1);
      if (0x7ffe < iVar9) {
        iVar9 = 0x7fff;
      }
      if (iVar9 < -0x7fff) {
        iVar9 = -0x8000;
      }
      uVar10 = *(short *)((long)quant_ptr + uVar6) * iVar9;
      sVar8 = ((ushort)(uVar10 >> 0x10) ^ uVar7) - uVar7;
      qcoeff_ptr[lVar5] = sVar8;
      dqcoeff_ptr[lVar5] = sVar8 * *(short *)((long)dequant_ptr + uVar6);
      if (0xffff < uVar10) {
        uVar2 = uVar4 & 0xffffffff;
      }
      uVar4 = uVar4 + 1;
    } while (n_coeffs != uVar4);
    uVar3 = (short)uVar2 + 1;
  }
  *eob_ptr = uVar3;
  return;
}

Assistant:

void av1_quantize_lp_c(const int16_t *coeff_ptr, intptr_t n_coeffs,
                       const int16_t *round_ptr, const int16_t *quant_ptr,
                       int16_t *qcoeff_ptr, int16_t *dqcoeff_ptr,
                       const int16_t *dequant_ptr, uint16_t *eob_ptr,
                       const int16_t *scan, const int16_t *iscan) {
  (void)iscan;
  int eob = -1;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
  for (int i = 0; i < n_coeffs; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;

    int tmp = clamp(abs_coeff + round_ptr[rc != 0], INT16_MIN, INT16_MAX);
    tmp = (tmp * quant_ptr[rc != 0]) >> 16;

    qcoeff_ptr[rc] = (tmp ^ coeff_sign) - coeff_sign;
    dqcoeff_ptr[rc] = qcoeff_ptr[rc] * dequant_ptr[rc != 0];

    if (tmp) eob = i;
  }
  *eob_ptr = eob + 1;
}